

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  cmGlobalGenerator *this_local;
  
  if (this->ExtraGenerator == (cmExternalMakefileProjectGenerator *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmExternalMakefileProjectGenerator::GetName_abi_cxx11_
              (__return_storage_ptr__,this->ExtraGenerator);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetExtraGeneratorName() const
{
  return this->ExtraGenerator ? this->ExtraGenerator->GetName()
                              : std::string();
}